

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_iarchive.h
# Opt level: O1

size_type __thiscall serialization::json_iarchive::load_sequence_start(json_iarchive *this)

{
  _Elt_pointer ppGVar1;
  _Elt_pointer ppGVar2;
  undefined8 *puVar3;
  _Elt_pointer ppGVar4;
  
  ppGVar2 = (this->stack_).c.
            super__Deque_base<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::allocator<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppGVar2 !=
      (this->stack_).c.
      super__Deque_base<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::allocator<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*>_>
      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    ppGVar1 = (this->stack_).c.
              super__Deque_base<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::allocator<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_first;
    ppGVar4 = ppGVar2;
    if (ppGVar2 == ppGVar1) {
      ppGVar4 = (this->stack_).c.
                super__Deque_base<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::allocator<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    if ((ppGVar4[-1]->data_).f.flags == 4) {
      if (ppGVar2 == ppGVar1) {
        ppGVar2 = (this->stack_).c.
                  super__Deque_base<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*,_std::allocator<const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_*>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      if ((ppGVar2[-1]->data_).f.flags == 4) {
        return (ppGVar2[-1]->data_).s.length;
      }
      __assert_fail("IsArray()",
                    "/workspace/llm4binary/github/license_c_cmakelists/avplayer[P]serialization2/examples/../include/serialization/detail/rapidjson/document.h"
                    ,0x6c2,
                    "ConstArray rapidjson::GenericValue<rapidjson::UTF8<>>::GetArray() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                   );
    }
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x18);
  *puVar3 = &PTR__exception_00120d50;
  puVar3[1] = "json";
  puVar3[2] = "expect array";
  __cxa_throw(puVar3,&serialization_error::typeinfo,std::exception::~exception);
}

Assistant:

size_type load_sequence_start() const
    {
        if(stack_.empty() || (!stack_.top()->IsArray()))
            throw_serialization_error("expect array", "json");
        return stack_.top()->GetArray().Size();
    }